

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

Literal_t * Lit_Alloc(uint *pTruth,int nVars,int varIdx,char pol)

{
  int iVar1;
  uint *pOut;
  uint *pTruth_00;
  Vec_Str_t *vOut;
  Literal_t *lit;
  Vec_Str_t *exp;
  uint *function;
  uint *transition;
  char pol_local;
  int varIdx_local;
  int nVars_local;
  uint *pTruth_local;
  
  if ((pol != '+') && (pol != '-')) {
    __assert_fail("pol == \'+\' || pol == \'-\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/rpo/literal.h"
                  ,0x88,"Literal_t *Lit_Alloc(unsigned int *, int, int, char)");
  }
  iVar1 = Kit_TruthWordNum(nVars);
  pOut = (uint *)malloc((long)iVar1 << 2);
  if (pol == '+') {
    Lit_TruthPositiveTransition(pTruth,pOut,nVars,varIdx);
  }
  else {
    Lit_TruthNegativeTransition(pTruth,pOut,nVars,varIdx);
  }
  iVar1 = Kit_TruthIsConst0(pOut,nVars);
  if (iVar1 == 0) {
    iVar1 = Kit_TruthWordNum(nVars);
    pTruth_00 = (uint *)malloc((long)iVar1 << 2);
    Kit_TruthIthVar(pTruth_00,nVars,varIdx);
    vOut = Vec_StrAlloc(5);
    if (pol == '-') {
      Kit_TruthNot(pTruth_00,pTruth_00,nVars);
      Vec_StrPutC(vOut,'!');
    }
    Vec_StrPutC(vOut,(char)varIdx + 'a');
    Vec_StrPutC(vOut,'\0');
    pTruth_local = (uint *)malloc(0x18);
    *(uint **)(pTruth_local + 2) = pTruth_00;
    *(uint **)pTruth_local = pOut;
    *(Vec_Str_t **)(pTruth_local + 4) = vOut;
  }
  else {
    if (pOut != (uint *)0x0) {
      free(pOut);
    }
    pTruth_local = (uint *)0x0;
  }
  return (Literal_t *)pTruth_local;
}

Assistant:

static inline Literal_t* Lit_Alloc(unsigned* pTruth, int nVars, int varIdx, char pol) {
    unsigned * transition;
    unsigned * function;
    Vec_Str_t * exp;
    Literal_t* lit;
    assert(pol == '+' || pol == '-');
    transition = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    if (pol == '+') {
        Lit_TruthPositiveTransition(pTruth, transition, nVars, varIdx);
    } else {
        Lit_TruthNegativeTransition(pTruth, transition, nVars, varIdx);
    }
    if (!Kit_TruthIsConst0(transition,nVars)) {
        function = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
        Kit_TruthIthVar(function, nVars, varIdx);
        //Abc_Print(-2, "Allocating function %X %d %c \n", *function, varIdx, pol);
        exp = Vec_StrAlloc(5);
        if (pol == '-') {
            Kit_TruthNot(function, function, nVars);
            Vec_StrPutC(exp, '!');
        }
        Vec_StrPutC(exp, (char)('a' + varIdx));
        Vec_StrPutC(exp, '\0');
        lit = ABC_ALLOC(Literal_t, 1);
        lit->function = function;
        lit->transition = transition;
        lit->expression = exp;
        return lit;
    } else {
        ABC_FREE(transition); // free the function.
        return NULL;
    }
}